

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::moveNext(QHexView *this,bool select)

{
  Mode MVar1;
  qint64 qVar2;
  qint64 qVar3;
  quint64 line;
  fd_set *__readfds;
  fd_set *__writefds;
  ulong uVar4;
  fd_set *pfVar5;
  undefined7 in_register_00000031;
  QHexCursor *pQVar6;
  fd_set *in_R8;
  timeval *in_R9;
  quint64 line_00;
  
  pQVar6 = (QHexCursor *)this->m_hexdocument;
  if (pQVar6 != (QHexCursor *)0x0) {
    pQVar6 = this->m_hexcursor;
  }
  qVar2 = QHexCursor::line(pQVar6);
  pQVar6 = (QHexCursor *)this->m_hexdocument;
  if (pQVar6 != (QHexCursor *)0x0) {
    pQVar6 = this->m_hexcursor;
  }
  qVar3 = QHexCursor::column(pQVar6);
  uVar4 = (ulong)((this->m_options).linelength - 1);
  __writefds = (fd_set *)(ulong)((long)uVar4 <= qVar3);
  pfVar5 = (fd_set *)0x0;
  if (qVar3 < (long)uVar4) {
    pfVar5 = (fd_set *)(qVar3 + 1);
  }
  pQVar6 = (QHexCursor *)this->m_hexdocument;
  if (pQVar6 != (QHexCursor *)0x0) {
    pQVar6 = this->m_hexcursor;
  }
  line_00 = (long)__writefds->fds_bits + qVar2;
  MVar1 = QHexCursor::mode(pQVar6);
  pQVar6 = (QHexCursor *)this->m_hexdocument;
  if (pQVar6 != (QHexCursor *)0x0) {
    pQVar6 = this->m_hexcursor;
  }
  line = lines(this);
  if ((long)line_00 < (long)line) {
    line = line_00;
  }
  qVar2 = getLastColumn(this,line_00);
  __readfds = (fd_set *)(qVar2 + (ulong)(MVar1 == Insert));
  if ((long)pfVar5 < (long)__readfds) {
    __readfds = pfVar5;
  }
  if ((int)CONCAT71(in_register_00000031,select) != 0) {
    QHexCursor::select(pQVar6,(int)line,__readfds,__writefds,in_R8,in_R9);
    return;
  }
  QHexCursor::move(pQVar6,line,(qint64)__readfds);
  return;
}

Assistant:

void QHexView::moveNext(bool select) {
    auto line = this->hexCursor()->line(), column = this->hexCursor()->column();

    if(column >= m_options.linelength - 1) {
        line++;
        column = 0;
    }
    else
        column++;

    qint64 offset =
        this->hexCursor()->mode() == QHexCursor::Mode::Insert ? 1 : 0;
    if(select)
        this->hexCursor()->select(
            qMin<qint64>(line, this->lines()),
            qMin<qint64>(column, this->getLastColumn(line) + offset));
    else
        this->hexCursor()->move(
            qMin<qint64>(line, this->lines()),
            qMin<qint64>(column, this->getLastColumn(line) + offset));
}